

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

bool __thiscall Memory::Recycler::VerifyMark(Recycler *this,void *objectAddress,void *target)

{
  int iVar1;
  HeapBlock *pHVar2;
  undefined4 extraout_var;
  HeapBlock *pHVar3;
  
  if (this->enableScanInteriorPointers == true) {
    pHVar2 = HeapBlockMap64::GetHeapBlock(&this->heapBlockMap,target);
    if (pHVar2 == (HeapBlock *)0x0) {
      return false;
    }
    iVar1 = (*pHVar2->_vptr_HeapBlock[8])(pHVar2,target);
    target = (void *)CONCAT44(extraout_var,iVar1);
    pHVar3 = (HeapBlock *)target;
  }
  else {
    pHVar2 = FindHeapBlock(this,target);
    pHVar3 = pHVar2;
  }
  if (pHVar3 == (HeapBlock *)0x0) {
    return false;
  }
  iVar1 = (*pHVar2->_vptr_HeapBlock[0xd])(pHVar2,objectAddress,target);
  return SUB41(iVar1,0);
}

Assistant:

bool
Recycler::VerifyMark(void * objectAddress, void * target)
{
    void * realAddress;
    HeapBlock * heapBlock;
    if (this->enableScanInteriorPointers)
    {
        heapBlock = heapBlockMap.GetHeapBlock(target);
        if (heapBlock == nullptr)
        {
            return false;
        }
        realAddress = heapBlock->GetRealAddressFromInterior(target);
        if (realAddress == nullptr)
        {
            return false;
        }
    }
    else
    {
        heapBlock = this->FindHeapBlock(target);
        if (heapBlock == nullptr)
        {
            return false;
        }
        realAddress = target;
    }
    return heapBlock->VerifyMark(objectAddress, realAddress);
}